

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

iterator * __thiscall
ft::multiset<int,_ft::greater<int>,_ft::allocator<int>_>::insert
          (iterator *__return_storage_ptr__,
          multiset<int,_ft::greater<int>,_ft::allocator<int>_> *this,value_type *val)

{
  node *curr;
  node *z;
  node *ret;
  value_type *val_local;
  multiset<int,_ft::greater<int>,_ft::allocator<int>_> *this_local;
  
  curr = treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::root
                   ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this);
  z = BSTinsert(this,curr,val);
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::fixInsertViolation
            ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this,z);
  (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_size =
       (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
       super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_size + 1;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
            (__return_storage_ptr__,
             &(this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
              super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree,z);
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(value_type const & val) {
		node*	ret = this->BSTinsert(this->root(), val);

		this->fixInsertViolation(ret);
		++this->m_size;
		return iterator(this->m_tree, ret);
	}